

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-multicast-join6.c
# Opt level: O2

int do_send(uv_udp_send_t *send_req)

{
  int iVar1;
  int64_t eval_b;
  int64_t eval_a;
  uv_buf_t local_38;
  sockaddr_in6 addr;
  
  local_38 = uv_buf_init("PING",4);
  iVar1 = uv_ip6_addr("ff02::1",0x23a3,&addr);
  if ((long)iVar1 == 0) {
    iVar1 = uv_udp_send(send_req,&client,&local_38,1,(sockaddr *)&addr,sv_send_cb);
    return iVar1;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-multicast-join6.c"
          ,0x5d,"uv_ip6_addr(\"ff02::1\", 9123, &addr)","==","0",(long)iVar1,"==",0);
  abort();
}

Assistant:

static int do_send(uv_udp_send_t* send_req) {
  uv_buf_t buf;
  struct sockaddr_in6 addr;
  
  buf = uv_buf_init("PING", 4);

  ASSERT_OK(uv_ip6_addr(MULTICAST_ADDR, TEST_PORT, &addr));

  /* client sends "PING" */
  return uv_udp_send(send_req,
                     &client,
                     &buf,
                     1,
                     (const struct sockaddr*) &addr,
                     sv_send_cb);
}